

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O3

void __thiscall
chrono::ChFrameMoving<double>::TransformLocalToParent
          (ChFrameMoving<double> *this,ChFrameMoving<double> *local,ChFrameMoving<double> *parent)

{
  ChCoordsys<double> *localpos;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  double local_48;
  double dStack_40;
  double local_38;
  
  ChFrame<double>::TransformLocalToParent
            (&this->super_ChFrame<double>,&local->super_ChFrame<double>,
             &parent->super_ChFrame<double>);
  localpos = &(local->super_ChFrame<double>).coord;
  PointSpeedLocalToParent(this,&localpos->pos,&(local->coord_dt).pos);
  if ((ChCoordsys<double> *)&local_48 != &parent->coord_dt) {
    (parent->coord_dt).pos.m_data[0] = local_48;
    (parent->coord_dt).pos.m_data[1] = dStack_40;
    (parent->coord_dt).pos.m_data[2] = local_38;
  }
  PointAccelerationLocalToParent
            (this,&localpos->pos,&(local->coord_dt).pos,&(local->coord_dtdt).pos);
  if ((ChCoordsys<double> *)&local_48 != &parent->coord_dtdt) {
    (parent->coord_dtdt).pos.m_data[0] = local_48;
    (parent->coord_dtdt).pos.m_data[1] = dStack_40;
    (parent->coord_dtdt).pos.m_data[2] = local_38;
  }
  dVar1 = (this->coord_dt).rot.m_data[1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1;
  auVar4 = *(undefined1 (*) [16])((this->coord_dt).rot.m_data + 2);
  auVar6 = *(undefined1 (*) [32])(local->super_ChFrame<double>).coord.rot.m_data;
  dVar2 = (this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar2;
  dVar3 = (local->super_ChFrame<double>).coord.rot.m_data[1];
  auVar47._24_8_ = dVar3;
  auVar47._16_8_ = dVar3;
  auVar5 = *(undefined1 (*) [16])((this->super_ChFrame<double>).coord.rot.m_data + 2);
  auVar7 = *(undefined1 (*) [32])(local->coord_dt).rot.m_data;
  auVar18 = vpermpd_avx2(*(undefined1 (*) [32])((local->super_ChFrame<double>).coord.rot.m_data + 2)
                         ,0x15);
  auVar17 = vpermpd_avx2(*(undefined1 (*) [32])((local->coord_dt).rot.m_data + 2),0x15);
  auVar10._0_8_ = -dVar1;
  auVar10._8_8_ = 0x8000000000000000;
  auVar8 = vpermpd_avx2(auVar6,1);
  auVar35._0_8_ = -auVar4._0_8_;
  auVar35._8_8_ = -auVar4._8_8_;
  auVar26._0_8_ = -dVar2;
  auVar26._8_8_ = 0x8000000000000000;
  auVar12 = vpermpd_avx2(auVar7,1);
  auVar41._0_8_ = -auVar5._0_8_;
  auVar41._8_8_ = -auVar5._8_8_;
  auVar19 = vunpcklpd_avx(auVar10,auVar19);
  auVar15._16_16_ = auVar10;
  auVar15._0_16_ = auVar35;
  auVar13._16_16_ = auVar4;
  auVar13._0_16_ = auVar19;
  auVar32._0_8_ = auVar8._0_8_ * auVar19._0_8_;
  auVar32._8_8_ = auVar8._8_8_ * auVar19._8_8_;
  auVar32._16_8_ = auVar8._16_8_ * auVar4._0_8_;
  auVar32._24_8_ = auVar8._24_8_ * auVar4._8_8_;
  dVar1 = (this->coord_dt).rot.m_data[0];
  auVar8._8_8_ = dVar1;
  auVar8._0_8_ = dVar1;
  auVar8._16_8_ = dVar1;
  auVar8._24_8_ = dVar1;
  auVar11 = vfmadd231pd_avx512vl(auVar32,auVar6,auVar8);
  dVar1 = (this->coord_dt).rot.m_data[3];
  auVar45._24_8_ = dVar1;
  auVar45._16_8_ = dVar1;
  dVar1 = (local->super_ChFrame<double>).coord.rot.m_data[2];
  auVar47._8_8_ = dVar1;
  auVar47._0_8_ = dVar1;
  auVar6 = vpermpd_avx2(auVar13,0x66);
  auVar6 = vshufpd_avx(auVar15,auVar6,9);
  auVar4 = vunpcklpd_avx(auVar26,auVar9);
  auVar22._16_16_ = auVar5;
  auVar22._0_16_ = auVar4;
  dVar1 = (local->coord_dt).rot.m_data[1];
  auVar37._24_8_ = dVar1;
  auVar37._16_8_ = dVar1;
  auVar24._0_8_ = auVar12._0_8_ * auVar4._0_8_;
  auVar24._8_8_ = auVar12._8_8_ * auVar4._8_8_;
  auVar24._16_8_ = auVar12._16_8_ * auVar5._0_8_;
  auVar24._24_8_ = auVar12._24_8_ * auVar5._8_8_;
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar12._8_8_ = dVar1;
  auVar12._0_8_ = dVar1;
  auVar12._16_8_ = dVar1;
  auVar12._24_8_ = dVar1;
  auVar12 = vfmadd231pd_avx512vl(auVar24,auVar7,auVar12);
  auVar7 = vpermpd_avx2(auVar22,0x66);
  auVar45._0_16_ = auVar35;
  dVar1 = (local->coord_dt).rot.m_data[2];
  auVar37._8_8_ = dVar1;
  auVar37._0_8_ = dVar1;
  auVar8 = vpermpd_avx2(auVar45,0x24);
  auVar4 = vfmadd213pd_fma(auVar47,auVar8,auVar11);
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar33._24_8_ = dVar1;
  auVar33._16_8_ = dVar1;
  auVar4 = vfmadd213pd_fma(auVar6,auVar18,ZEXT1632(auVar4));
  auVar33._0_16_ = auVar41;
  auVar6 = vpermpd_avx2(auVar33,0x24);
  auVar5 = vfmadd213pd_fma(auVar37,auVar6,auVar12);
  auVar18._16_16_ = auVar26;
  auVar18._0_16_ = auVar41;
  auVar6 = vshufpd_avx(auVar18,auVar7,9);
  auVar5 = vfmadd213pd_fma(auVar6,auVar17,ZEXT1632(auVar5));
  (parent->coord_dt).rot.m_data[0] = auVar4._0_8_ + auVar5._0_8_;
  (parent->coord_dt).rot.m_data[1] = auVar4._8_8_ + auVar5._8_8_;
  (parent->coord_dt).rot.m_data[2] = 0.0;
  (parent->coord_dt).rot.m_data[3] = 0.0;
  dVar1 = (this->coord_dtdt).rot.m_data[1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1;
  auVar4 = *(undefined1 (*) [16])((this->coord_dtdt).rot.m_data + 2);
  auVar6 = *(undefined1 (*) [32])(local->super_ChFrame<double>).coord.rot.m_data;
  dVar2 = (this->coord_dt).rot.m_data[1];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[1];
  auVar9 = vmovddup_avx512vl(auVar5);
  auVar5 = *(undefined1 (*) [16])((this->coord_dt).rot.m_data + 2);
  auVar7 = *(undefined1 (*) [32])(local->coord_dt).rot.m_data;
  auVar13 = vpermpd_avx512vl(*(undefined1 (*) [32])((local->coord_dt).rot.m_data + 2),0x15);
  auVar17 = vpermpd_avx2(*(undefined1 (*) [32])((local->super_ChFrame<double>).coord.rot.m_data + 2)
                         ,0x15);
  dVar3 = (this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar3;
  auVar18 = *(undefined1 (*) [32])(local->coord_dtdt).rot.m_data;
  auVar19 = *(undefined1 (*) [16])((this->super_ChFrame<double>).coord.rot.m_data + 2);
  auVar27._0_8_ = -dVar1;
  auVar27._8_8_ = 0x8000000000000000;
  auVar12 = vpermpd_avx512vl(auVar6,1);
  auVar43._0_8_ = auVar4._0_8_ ^ 0x8000000000000000;
  auVar43._8_8_ = auVar4._8_8_ ^ 0x8000000000000000;
  auVar36._0_8_ = -dVar2;
  auVar36._8_8_ = 0x8000000000000000;
  auVar14 = vpermpd_avx512vl(auVar7,1);
  auVar46._0_8_ = auVar5._0_8_ ^ 0x8000000000000000;
  auVar46._8_8_ = auVar5._8_8_ ^ 0x8000000000000000;
  auVar20._0_8_ = -dVar3;
  auVar20._8_8_ = 0x8000000000000000;
  auVar15 = vpermpd_avx512vl(auVar18,1);
  auVar21._0_8_ = auVar19._0_8_ ^ 0x8000000000000000;
  auVar21._8_8_ = auVar19._8_8_ ^ 0x8000000000000000;
  auVar8 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])((local->coord_dtdt).rot.m_data + 2)),0x15);
  auVar10 = vunpcklpd_avx(auVar27,auVar23);
  auVar28._16_16_ = auVar27;
  auVar28._0_16_ = auVar43;
  auVar25._16_16_ = auVar4;
  auVar25._0_16_ = auVar10;
  auVar12 = vmulpd_avx512vl(auVar12,auVar25);
  dVar1 = (this->coord_dtdt).rot.m_data[0];
  auVar11._8_8_ = dVar1;
  auVar11._0_8_ = dVar1;
  auVar11._16_8_ = dVar1;
  auVar11._24_8_ = dVar1;
  auVar11 = vfmadd231pd_avx512vl(auVar12,auVar6,auVar11);
  dVar1 = (this->coord_dtdt).rot.m_data[3];
  auVar48._24_8_ = dVar1;
  auVar48._16_8_ = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[2];
  auVar10 = vmovddup_avx512vl(auVar4);
  auVar6 = vpermpd_avx2(auVar25,0x66);
  auVar6 = vshufpd_avx(auVar28,auVar6,9);
  auVar4 = vunpcklpd_avx(auVar36,auVar31);
  auVar29._16_16_ = auVar5;
  auVar29._0_16_ = auVar4;
  dVar1 = (local->coord_dt).rot.m_data[1];
  auVar44._24_8_ = dVar1;
  auVar44._16_8_ = dVar1;
  auVar12 = vmulpd_avx512vl(auVar14,auVar29);
  dVar1 = (this->coord_dt).rot.m_data[0];
  auVar14._8_8_ = dVar1;
  auVar14._0_8_ = dVar1;
  auVar14._16_8_ = dVar1;
  auVar14._24_8_ = dVar1;
  auVar14 = vfmadd231pd_avx512vl(auVar12,auVar7,auVar14);
  auVar7 = vpermpd_avx2(auVar29,0x66);
  auVar48._0_16_ = auVar43;
  auVar16 = vinsertf32x4_avx512vl(ZEXT1632(auVar10),auVar9,1);
  dVar1 = (local->coord_dt).rot.m_data[2];
  auVar44._8_8_ = dVar1;
  auVar44._0_8_ = dVar1;
  auVar12 = vpermpd_avx2(auVar48,0x24);
  auVar12 = vfmadd213pd_avx512vl(auVar16,auVar12,auVar11);
  dVar1 = (this->coord_dt).rot.m_data[3];
  auVar42._24_8_ = dVar1;
  auVar42._16_8_ = dVar1;
  auVar17 = vfmadd213pd_avx512vl(auVar6,auVar17,auVar12);
  auVar42._0_16_ = auVar46;
  auVar6 = vpermpd_avx2(auVar42,0x24);
  auVar4 = vfmadd213pd_fma(auVar44,auVar6,auVar14);
  auVar34._16_16_ = auVar36;
  auVar34._0_16_ = auVar46;
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar38._24_8_ = dVar1;
  auVar38._16_8_ = dVar1;
  dVar1 = (local->coord_dtdt).rot.m_data[1];
  auVar40._24_8_ = dVar1;
  auVar40._16_8_ = dVar1;
  auVar6 = vshufpd_avx(auVar34,auVar7,9);
  auVar12 = vfmadd213pd_avx512vl(auVar6,auVar13,ZEXT1632(auVar4));
  auVar38._0_16_ = auVar21;
  auVar7 = vpermpd_avx2(auVar38,0x24);
  auVar4 = vunpcklpd_avx(auVar20,auVar39);
  dVar1 = (local->coord_dtdt).rot.m_data[2];
  auVar40._8_8_ = dVar1;
  auVar40._0_8_ = dVar1;
  auVar16._16_16_ = auVar20;
  auVar16._0_16_ = auVar21;
  auVar30._16_16_ = auVar19;
  auVar30._0_16_ = auVar4;
  auVar11 = vmulpd_avx512vl(auVar15,auVar30);
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar6._8_8_ = dVar1;
  auVar6._0_8_ = dVar1;
  auVar6._16_8_ = dVar1;
  auVar6._24_8_ = dVar1;
  auVar18 = vfmadd231pd_avx512vl(auVar11,auVar18,auVar6);
  auVar6 = vpermpd_avx2(auVar30,0x66);
  auVar6 = vshufpd_avx(auVar16,auVar6,9);
  auVar4 = vfmadd213pd_fma(auVar40,auVar7,auVar18);
  auVar4 = vfmadd213pd_fma(auVar6,auVar8,ZEXT1632(auVar4));
  (parent->coord_dtdt).rot.m_data[0] = auVar17._0_8_ + auVar12._0_8_ + auVar12._0_8_ + auVar4._0_8_;
  (parent->coord_dtdt).rot.m_data[1] = auVar17._8_8_ + auVar12._8_8_ + auVar12._8_8_ + auVar4._8_8_;
  (parent->coord_dtdt).rot.m_data[2] = auVar17._16_8_ + auVar12._16_8_ + auVar12._16_8_ + 0.0;
  (parent->coord_dtdt).rot.m_data[3] = auVar17._24_8_ + auVar12._24_8_ + auVar12._24_8_ + 0.0;
  return;
}

Assistant:

void TransformLocalToParent(
        const ChFrameMoving<Real>& local,  ///< frame to transform, given in local frame coordinates
        ChFrameMoving<Real>& parent        ///< transformed frame, in parent coordinates, will be stored here
    ) const {
        // pos & rot
        ChFrame<Real>::TransformLocalToParent(local, parent);

        // pos_dt
        parent.coord_dt.pos = PointSpeedLocalToParent(local.coord.pos, local.coord_dt.pos);

        // pos_dtdt
        parent.coord_dtdt.pos =
            PointAccelerationLocalToParent(local.coord.pos, local.coord_dt.pos, local.coord_dtdt.pos);

        // rot_dt
        parent.coord_dt.rot = coord_dt.rot % local.coord.rot + this->coord.rot % local.coord_dt.rot;

        // rot_dtdt
        parent.coord_dtdt.rot = coord_dtdt.rot % local.coord.rot + (coord_dt.rot % local.coord_dt.rot) * 2 +
                                this->coord.rot % local.coord_dtdt.rot;
    }